

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
llvm::SmallVectorImpl<std::__cxx11::string>::emplace_back<llvm::StringRef&>
          (SmallVectorImpl<std::__cxx11::string> *this,StringRef *Args)

{
  char *pcVar1;
  size_t sVar2;
  string *psVar3;
  
  if (*(uint *)(this + 0xc) <= *(uint *)(this + 8)) {
    SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ::grow((SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
            *)this,0);
  }
  psVar3 = (string *)((ulong)*(uint *)(this + 8) * 0x20 + *(long *)this);
  pcVar1 = Args->Data;
  if (pcVar1 == (char *)0x0) {
    *(string **)psVar3 = psVar3 + 0x10;
    *(undefined8 *)(psVar3 + 8) = 0;
    psVar3[0x10] = (string)0x0;
  }
  else {
    sVar2 = Args->Length;
    *(string **)psVar3 = psVar3 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>(psVar3,pcVar1,pcVar1 + sVar2);
  }
  if (*(uint *)(this + 8) < *(uint *)(this + 0xc)) {
    *(uint *)(this + 8) = *(uint *)(this + 8) + 1;
    return;
  }
  __assert_fail("Size <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void emplace_back(ArgTypes &&... Args) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    ::new ((void *)this->end()) T(std::forward<ArgTypes>(Args)...);
    this->set_size(this->size() + 1);
  }